

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantUnion.h
# Opt level: O1

void __thiscall
glslang::TConstUnionArray::TConstUnionArray(TConstUnionArray *this,int size,TConstUnion *val)

{
  TPoolAllocator *this_00;
  vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_> *this_01;
  allocator_type local_30;
  
  this->_vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_0093b5a8;
  this_00 = GetThreadPoolAllocator();
  this_01 = (vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_> *)
            TPoolAllocator::allocate(this_00,0x20);
  local_30.allocator = GetThreadPoolAllocator();
  std::vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>::vector
            (this_01,(long)size,val,&local_30);
  this->unionArray = (TConstUnionVector *)this_01;
  return;
}

Assistant:

TConstUnionArray(int size, const TConstUnion& val)
    {
        unionArray = new TConstUnionVector(size, val);
    }